

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_strategy.cpp
# Opt level: O0

array<unsigned_char,_7UL> license::hw_identifier::generate_id_by_sn(DiskInfo *disk_info)

{
  array<unsigned_char,_7UL> aVar1;
  unsigned_long *puVar2;
  reference __dest;
  unsigned_long local_30 [2];
  size_t local_20;
  size_t size;
  DiskInfo *disk_info_local;
  array<unsigned_char,_7UL> a_disk_id;
  
  disk_info_local._4_3_ = 0;
  disk_info_local._0_4_ = 0;
  local_30[1] = 7;
  local_30[0] = 8;
  size = (size_t)disk_info;
  puVar2 = std::min<unsigned_long>(local_30 + 1,local_30);
  local_20 = *puVar2;
  __dest = std::array<unsigned_char,_7UL>::operator[]
                     ((array<unsigned_char,_7UL> *)&disk_info_local,0);
  memcpy(__dest,(void *)(size + 0x404),local_20);
  aVar1._M_elems[0] = disk_info_local._0_1_;
  aVar1._M_elems[1] = disk_info_local._1_1_;
  aVar1._M_elems[2] = disk_info_local._2_1_;
  aVar1._M_elems[3] = disk_info_local._3_1_;
  aVar1._M_elems[4] = disk_info_local._4_1_;
  aVar1._M_elems[5] = disk_info_local._5_1_;
  aVar1._M_elems[6] = disk_info_local._6_1_;
  return (array<unsigned_char,_7UL>)aVar1._M_elems;
}

Assistant:

static array<uint8_t, HW_IDENTIFIER_PROPRIETARY_DATA> generate_id_by_sn(const DiskInfo &disk_info) {
	array<uint8_t, HW_IDENTIFIER_PROPRIETARY_DATA> a_disk_id = {};
	size_t size = min((size_t) HW_IDENTIFIER_PROPRIETARY_DATA,
			sizeof(disk_info.disk_sn));
	memcpy(&a_disk_id[0], disk_info.disk_sn, size);

	return a_disk_id;
}